

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::MultipleReporters::noMatchingTestCases(MultipleReporters *this,string *spec)

{
  pointer pPVar1;
  pointer pPVar2;
  
  pPVar1 = (this->m_reporters).
           super__Vector_base<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (this->m_reporters).
                super__Vector_base<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    (*(pPVar2->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[5])(pPVar2->m_p,spec);
  }
  return;
}

Assistant:

virtual std::string toString() const {
                return "contains: \"" + m_data.m_str  + "\"" + m_data.toStringSuffix();
            }